

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O2

size_t fio_str_utf8_valid(fio_str_s *s)

{
  byte bVar1;
  ulong uVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  uint uVar6;
  
  if (s == (fio_str_s *)0x0) {
    return 0;
  }
  if ((s->small == 0) && (puVar4 = (uint8_t *)s->data, puVar4 != (uint8_t *)0x0)) {
    uVar2 = s->len;
  }
  else {
    uVar2 = (ulong)(s->small >> 1);
    puVar4 = s->reserved;
  }
  if (uVar2 == 0) {
    return 1;
  }
  puVar3 = puVar4 + uVar2;
  while( true ) {
    bVar1 = *puVar4;
    uVar6 = (uint)bVar1;
    if (3 < "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x05\x05\x05\x05\x05\x05\x05\x05\x02\x02\x02\x02\x03\x03\x04"
            [bVar1 >> 3] - 1) break;
    switch((uint)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x05\x05\x05\x05\x05\x05\x05\x05\x02\x02\x02\x02\x03\x03\x04"
                 [bVar1 >> 3]) {
    case 1:
      puVar5 = puVar4 + 1;
      break;
    case 2:
      puVar5 = puVar4 + 2;
      if ((puVar3 < puVar5) || ((puVar4[1] & 0xffffffc0) != 0x80)) goto LAB_0014fc19;
      uVar6 = (bVar1 & 0x1f) << 6 | puVar4[1] & 0x3f;
      break;
    case 3:
      puVar5 = puVar4 + 3;
      if (((puVar3 < puVar5) || ((puVar4[1] & 0xffffffc0) != 0x80)) || ((puVar4[2] & 0xc0) != 0x80))
      goto LAB_0014fc19;
      uVar6 = puVar4[2] & 0x3f | (puVar4[1] & 0x3f) << 6 | (bVar1 & 0xf) << 0xc;
      break;
    case 4:
      puVar5 = puVar4 + 4;
      if ((((puVar3 < puVar5) || ((puVar4[1] & 0xffffffc0) != 0x80)) || ((puVar4[2] & 0xc0) != 0x80)
          ) || ((puVar4[3] & 0xffffffc0) != 0x80)) goto LAB_0014fc19;
      uVar6 = puVar4[3] & 0x3f |
              (puVar4[2] & 0x3f) << 6 | (puVar4[1] & 0x3f) << 0xc | (bVar1 & 7) << 0x12;
    }
    if ((uVar6 == 0) || (puVar4 = puVar5, puVar3 <= puVar5)) goto LAB_0014fc1b;
  }
LAB_0014fc19:
  uVar6 = 0xffffffff;
  puVar5 = puVar4;
LAB_0014fc1b:
  return (ulong)(-1 < (int)uVar6 && puVar5 == puVar3);
}

Assistant:

FIO_FUNC size_t fio_str_utf8_valid(fio_str_s *s) {
  if (!s)
    return 0;
  fio_str_info_s state = fio_str_info(s);
  if (!state.len)
    return 1;
  char *const end = state.data + state.len;
  int32_t c = 0;
  do {
    FIO_STR_UTF8_CODE_POINT(state.data, end, c);
  } while (c > 0 && state.data < end);
  return state.data == end && c >= 0;
}